

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# field_impl.h
# Opt level: O2

void secp256k1_fe_negate_unchecked(secp256k1_fe *r,secp256k1_fe *a,int m)

{
  ulong uVar1;
  ulong uVar2;
  undefined8 uVar3;
  char *pcVar4;
  ulong uVar5;
  char *pcVar6;
  
  secp256k1_fe_verify(a);
  if (m < a->magnitude) {
    pcVar4 = 
    "/workspace/llm4binary/github/license_all_cmakelists_25/jonasnick[P]secp256k1-zkp/src/field_impl.h"
    ;
    pcVar6 = "test condition failed: a->magnitude <= m";
    uVar3 = 0x128;
  }
  else {
    uVar1 = (ulong)(m + 1U);
    uVar5 = (ulong)(uint)m * 0x1ffffffffffffe;
    if (uVar1 * 0x1ffffdfffff85e < uVar5) {
      pcVar4 = 
      "/workspace/llm4binary/github/license_all_cmakelists_25/jonasnick[P]secp256k1-zkp/src/field_5x52_impl.h"
      ;
      pcVar6 = 
      "test condition failed: 0xFFFFEFFFFFC2FULL * 2 * (m + 1) >= 0xFFFFFFFFFFFFFULL * 2 * m";
      uVar3 = 0x13f;
    }
    else {
      uVar2 = uVar1 * 0x1ffffffffffffe;
      if (uVar2 < uVar5) {
        pcVar4 = 
        "/workspace/llm4binary/github/license_all_cmakelists_25/jonasnick[P]secp256k1-zkp/src/field_5x52_impl.h"
        ;
        pcVar6 = 
        "test condition failed: 0xFFFFFFFFFFFFFULL * 2 * (m + 1) >= 0xFFFFFFFFFFFFFULL * 2 * m";
        uVar3 = 0x140;
      }
      else {
        if ((ulong)(uint)m * 0x1fffffffffffe <= uVar1 * 0x1fffffffffffe) {
          r->n[0] = uVar1 * 0x1ffffdfffff85e - a->n[0];
          r->n[1] = uVar2 - a->n[1];
          r->n[2] = uVar2 - a->n[2];
          r->n[3] = uVar2 - a->n[3];
          r->n[4] = uVar1 * 0x1fffffffffffe - a->n[4];
          r->magnitude = m + 1U;
          r->normalized = 0;
          secp256k1_fe_verify(r);
          return;
        }
        pcVar4 = 
        "/workspace/llm4binary/github/license_all_cmakelists_25/jonasnick[P]secp256k1-zkp/src/field_5x52_impl.h"
        ;
        pcVar6 = 
        "test condition failed: 0x0FFFFFFFFFFFFULL * 2 * (m + 1) >= 0x0FFFFFFFFFFFFULL * 2 * m";
        uVar3 = 0x141;
      }
    }
  }
  fprintf(_stderr,"%s:%d: %s\n",pcVar4,uVar3,pcVar6);
  abort();
}

Assistant:

SECP256K1_INLINE static void secp256k1_fe_negate_unchecked(secp256k1_fe *r, const secp256k1_fe *a, int m) {
    secp256k1_fe_verify(a);
    VERIFY_CHECK(m >= 0 && m <= 31);
    VERIFY_CHECK(a->magnitude <= m);
    secp256k1_fe_impl_negate_unchecked(r, a, m);
    r->magnitude = m + 1;
    r->normalized = 0;
    secp256k1_fe_verify(r);
}